

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O2

MPP_RET __thiscall Mpp::notify(Mpp *this,RK_U32 flag)

{
  MPP_RET MVar1;
  
  if (this->mType == MPP_CTX_ENC) {
    MVar1 = mpp_enc_notify_v2(this->mEnc,flag);
    return MVar1;
  }
  if (this->mType == MPP_CTX_DEC) {
    MVar1 = mpp_dec_notify(this->mDec,flag);
    return MVar1;
  }
  _mpp_log_l(2,"mpp","unsupport context type %d\n",(char *)0x0);
  return MPP_NOK;
}

Assistant:

MPP_RET Mpp::notify(RK_U32 flag)
{
    switch (mType) {
    case MPP_CTX_DEC : {
        return mpp_dec_notify(mDec, flag);
    } break;
    case MPP_CTX_ENC : {
        return mpp_enc_notify_v2(mEnc, flag);
    } break;
    default : {
        mpp_err("unsupport context type %d\n", mType);
    } break;
    }
    return MPP_NOK;
}